

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.cc
# Opt level: O2

StringRep * __thiscall
google::protobuf::internal::MicroString::AllocateStringRep(MicroString *this,Arena *arena)

{
  LargeRepKind v1;
  StringRep *pSVar1;
  Nullable<const_char_*> failure_msg;
  LogMessageFatal local_20;
  
  pSVar1 = Arena::Create<google::protobuf::internal::MicroString::StringRep>(arena);
  (pSVar1->super_LargeRep).capacity = 2;
  this->rep_ = (void *)((ulong)pSVar1 | 1);
  v1 = large_rep_kind(this);
  failure_msg = absl::lts_20250127::log_internal::Check_EQImpl(v1,2,"+large_rep_kind() == +kString")
  ;
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    return pSVar1;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string.cc"
             ,0x9a,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

MicroString::StringRep* MicroString::AllocateStringRep(Arena* arena) {
  StringRep* h = Arena::Create<StringRep>(arena);
  h->capacity = kString;
  rep_ =
      reinterpret_cast<void*>(reinterpret_cast<uintptr_t>(h) | kIsLargeRepTag);
  ABSL_DCHECK_EQ(+large_rep_kind(), +kString);
  return h;
}